

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

void __thiscall
duckdb::TopNBoundaryValue::UpdateValue(TopNBoundaryValue *this,string_t boundary_val)

{
  bool bVar1;
  DynamicFilterData *this_00;
  OrderModifiers in_R9W;
  string_t sort_key;
  unique_lock<std::mutex> l;
  Value new_dynamic_value;
  anon_union_16_2_67f50693_for_value local_b0;
  unique_lock<std::mutex> local_a0;
  Value local_90;
  Value local_50;
  
  local_b0.pointer.ptr = (char *)boundary_val.value._8_8_;
  local_b0._0_8_ = boundary_val.value._0_8_;
  ::std::unique_lock<std::mutex>::unique_lock(&local_a0,&this->lock);
  if (this->is_set == true) {
    string_t::string_t((string_t *)&local_90,&this->boundary_value);
    bVar1 = string_t::StringComparisonOperators::GreaterThan
                      ((string_t *)&local_90,(string_t *)&local_b0.pointer);
    if (!bVar1) goto LAB_019f566e;
  }
  string_t::GetString_abi_cxx11_((string *)&local_90,(string_t *)&local_b0.pointer);
  ::std::__cxx11::string::operator=((string *)&this->boundary_value,(string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  this->is_set = true;
  if ((this->op->dynamic_filter).internal.
      super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    sort_key.value.pointer.ptr = (char *)&this->boundary_vector;
    sort_key.value._0_8_ = local_b0.pointer.ptr;
    CreateSortKeyHelpers::DecodeSortKey
              ((CreateSortKeyHelpers *)local_b0._0_8_,sort_key,(Vector *)0x0,
               (ulong)*(uint *)&this->boundary_modifiers,in_R9W);
    Vector::GetValue(&local_90,&this->boundary_vector,0);
    ::std::unique_lock<std::mutex>::unlock(&local_a0);
    this_00 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(&this->op->dynamic_filter);
    Value::Value(&local_50,&local_90);
    DynamicFilterData::SetValue(this_00,&local_50);
    Value::~Value(&local_50);
    Value::~Value(&local_90);
  }
LAB_019f566e:
  ::std::unique_lock<std::mutex>::~unique_lock(&local_a0);
  return;
}

Assistant:

void UpdateValue(string_t boundary_val) {
		unique_lock<mutex> l(lock);
		if (!is_set || boundary_val < string_t(boundary_value)) {
			boundary_value = boundary_val.GetString();
			is_set = true;
			if (op.dynamic_filter) {
				CreateSortKeyHelpers::DecodeSortKey(boundary_val, boundary_vector, 0, boundary_modifiers);
				auto new_dynamic_value = boundary_vector.GetValue(0);
				l.unlock();
				op.dynamic_filter->SetValue(std::move(new_dynamic_value));
			}
		}
	}